

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O2

set<int,_std::less<int>,_std::allocator<int>_> *
blockHasVar(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,VarId *var,
           map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
           *def,map<int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>_>_>
                *use)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  _Base_ptr p_Var3;
  _Base_ptr *pp_Var4;
  long lVar5;
  _Self __tmp_1;
  _Self __tmp;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (def->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var3 == &(def->_M_t)._M_impl.super__Rb_tree_header) {
      p_Var3 = (use->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((_Rb_tree_header *)p_Var3 == &(use->_M_t)._M_impl.super__Rb_tree_header) {
          return __return_storage_ptr__;
        }
        lVar5 = ((long)p_Var3[1]._M_left - (long)p_Var3[1]._M_parent >> 4) + 1;
        pp_Var4 = &(p_Var3[1]._M_parent)->_M_parent;
        do {
          lVar5 = lVar5 + -1;
          if (lVar5 == 0) goto LAB_001732ea;
          uVar2 = *(uint32_t *)pp_Var4;
          pp_Var4 = pp_Var4 + 2;
        } while (uVar2 != var->id);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   __return_storage_ptr__,(int *)(p_Var3 + 1));
LAB_001732ea:
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while( true );
    }
    lVar5 = ((long)p_Var3[1]._M_left - (long)p_Var3[1]._M_parent >> 4) + 1;
    pp_Var4 = &(p_Var3[1]._M_parent)->_M_parent;
    do {
      lVar5 = lVar5 + -1;
      if (lVar5 == 0) goto LAB_0017329a;
      uVar2 = *(uint32_t *)pp_Var4;
      pp_Var4 = pp_Var4 + 2;
    } while (uVar2 != var->id);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               __return_storage_ptr__,(int *)(p_Var3 + 1));
LAB_0017329a:
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

set<int> blockHasVar(mir::inst::VarId var,
                     map<int, vector<mir::inst::VarId>> def,
                     map<int, vector<mir::inst::VarId>> use) {
  map<int, vector<mir::inst::VarId>>::iterator it;
  set<int> s;
  for (it = def.begin(); it != def.end(); it++) {
    for (int i = 0; i < it->second.size(); i++) {
      if (it->second[i] == var) {
        s.insert(it->first);
        break;
      }
    }
  }
  for (it = use.begin(); it != use.end(); it++) {
    for (int i = 0; i < it->second.size(); i++) {
      if (it->second[i] == var) {
        s.insert(it->first);
        break;
      }
    }
  }
  return s;
}